

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O1

void amrex::computeDivergence(MultiFab *divu,Array<const_MultiFab_*,_3> *umac,Geometry *geom)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  bool bVar19;
  Real dzi;
  Real dyi;
  Real dxi;
  MFIter mfi;
  int local_24c;
  long local_248;
  Box local_1ac;
  Array4<double> local_190;
  Array4<const_double> local_150;
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  dVar1 = (geom->super_CoordSys).inv_dx[0];
  dVar2 = (geom->super_CoordSys).inv_dx[1];
  dVar3 = (geom->super_CoordSys).inv_dx[2];
  MFIter::MFIter(&local_90,(FabArrayBase *)divu,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_1ac,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,&divu->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,&umac->_M_elems[0]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,&umac->_M_elems[1]->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&umac->_M_elems[2]->super_FabArray<amrex::FArrayBox>,&local_90);
      if (0 < (long)local_190.ncomp) {
        lVar10 = (long)local_1ac.smallend.vect[1];
        lVar8 = (long)local_1ac.smallend.vect[0] * 8;
        local_248 = 0;
        lVar6 = 0;
        do {
          iVar4 = local_1ac.smallend.vect[2];
          local_24c = local_1ac.smallend.vect[2];
          if (local_1ac.smallend.vect[2] <= local_1ac.bigend.vect[2]) {
            do {
              local_24c = local_24c + 1;
              if (local_1ac.smallend.vect[1] <= local_1ac.bigend.vect[1]) {
                lVar15 = (long)iVar4;
                lVar18 = (long)local_190.p +
                         local_190.nstride * local_248 +
                         (lVar10 - local_190.begin.y) * local_190.jstride * 8 +
                         (lVar15 - local_190.begin.z) * local_190.kstride * 8 +
                         (long)local_190.begin.x * -8 + lVar8;
                lVar17 = local_150.jstride * 8;
                lVar11 = (lVar10 - local_150.begin.y) * lVar17;
                lVar12 = (long)local_150.p +
                         (lVar15 - local_150.begin.z) * local_150.kstride * 8 + lVar11 +
                         local_150.nstride * local_248 + (long)local_150.begin.x * -8 + lVar8;
                lVar9 = (long)local_150.p +
                        local_150.nstride * local_248 + lVar11 +
                        (long)(local_24c - local_150.begin.z) * local_150.kstride * 8 +
                        (long)local_150.begin.x * -8 + lVar8;
                lVar5 = local_110.jstride * 8;
                lVar11 = local_110.nstride * local_248 +
                         (lVar15 - local_110.begin.z) * local_110.kstride * 8;
                lVar13 = (long)local_110.p +
                         (lVar10 - local_110.begin.y) * lVar5 + lVar11 +
                         (long)local_110.begin.x * -8 + lVar8;
                iVar7 = (local_1ac.smallend.vect[1] + 1) - local_110.begin.y;
                lVar16 = (long)local_d0.p +
                         local_d0.nstride * local_248 +
                         (lVar10 - local_d0.begin.y) * local_d0.jstride * 8 +
                         (lVar15 - local_d0.begin.z) * local_d0.kstride * 8 +
                         (long)local_d0.begin.x * -8 + lVar8 + 8;
                lVar15 = lVar10;
                do {
                  if (local_1ac.smallend.vect[0] <= local_1ac.bigend.vect[0]) {
                    lVar14 = 0;
                    do {
                      *(double *)(lVar18 + lVar14 * 8) =
                           (*(double *)(lVar9 + lVar14 * 8) - *(double *)(lVar12 + lVar14 * 8)) *
                           dVar3 + (*(double *)
                                     ((long)local_110.p +
                                     lVar14 * 8 +
                                     iVar7 * lVar5 + lVar11 + (long)local_110.begin.x * -8 + lVar8)
                                   - *(double *)(lVar13 + lVar14 * 8)) * dVar2 +
                                   (*(double *)(lVar16 + lVar14 * 8) -
                                   *(double *)(lVar16 + -8 + lVar14 * 8)) * dVar1;
                      lVar14 = lVar14 + 1;
                    } while ((local_1ac.bigend.vect[0] - local_1ac.smallend.vect[0]) + 1 !=
                             (int)lVar14);
                  }
                  lVar15 = lVar15 + 1;
                  lVar18 = lVar18 + local_190.jstride * 8;
                  lVar12 = lVar12 + lVar17;
                  lVar9 = lVar9 + lVar17;
                  lVar13 = lVar13 + lVar5;
                  iVar7 = iVar7 + 1;
                  lVar16 = lVar16 + local_d0.jstride * 8;
                } while (local_1ac.bigend.vect[1] + 1 != (int)lVar15);
              }
              bVar19 = iVar4 != local_1ac.bigend.vect[2];
              iVar4 = iVar4 + 1;
            } while (bVar19);
          }
          lVar6 = lVar6 + 1;
          local_248 = local_248 + 8;
        } while (lVar6 != local_190.ncomp);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void computeDivergence (MultiFab& divu, const Array<MultiFab const*,AMREX_SPACEDIM>& umac,
                            const Geometry& geom)
    {
        AMREX_D_TERM(AMREX_ASSERT(divu.nComp()==umac[0]->nComp());,
                     AMREX_ASSERT(divu.nComp()==umac[1]->nComp());,
                     AMREX_ASSERT(divu.nComp()==umac[2]->nComp()));

#if (AMREX_SPACEDIM==2)
        const auto& ba = divu.boxArray();
        const auto& dm = divu.DistributionMap();
        MultiFab volume, areax, areay;
        if (geom.IsRZ()) {
            geom.GetVolume(volume, ba, dm, 0);
            geom.GetFaceArea(areax, ba, dm, 0, 0);
            geom.GetFaceArea(areay, ba, dm, 1, 0);
        }
#endif

        const GpuArray<Real,AMREX_SPACEDIM> dxinv = geom.InvCellSizeArray();

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(divu,TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& divuarr = divu.array(mfi);
            AMREX_D_TERM(Array4<Real const> const& uarr = umac[0]->const_array(mfi);,
                         Array4<Real const> const& varr = umac[1]->const_array(mfi);,
                         Array4<Real const> const& warr = umac[2]->const_array(mfi););

#if (AMREX_SPACEDIM==2)
            if (geom.IsRZ()) {
                Array4<Real const> const&  ax =  areax.array(mfi);
                Array4<Real const> const&  ay =  areay.array(mfi);
                Array4<Real const> const& vol = volume.array(mfi);

                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_divergence_rz(tbx,divuarr,AMREX_D_DECL(uarr,varr,warr),ax,ay,vol);
                });
            } else
#endif
            {
                AMREX_LAUNCH_HOST_DEVICE_LAMBDA (bx, tbx,
                {
                    amrex_compute_divergence(tbx,divuarr,AMREX_D_DECL(uarr,varr,warr),dxinv);
                });
            }
        }
    }